

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O0

void __thiscall ui::Led::FetchState(Led *this)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  char *pcVar4;
  size_type sVar5;
  string local_668 [32];
  ulong local_648;
  size_t right;
  size_t left;
  stringstream ss;
  undefined1 local_4b0 [8];
  string entry;
  string trigger;
  istream local_450 [8];
  ifstream file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_ifstream<char,_std::char_traits<char>_> local_218 [520];
  Led *local_10;
  Led *this_local;
  
  local_10 = this;
  std::operator+(&local_238,&this->file_path_,"/brightness");
  std::ifstream::ifstream(local_218,(string *)&local_238,_S_in);
  std::operator>>(local_218,&this->brightness_);
  std::ifstream::~ifstream(local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->trigger_entries_);
  this->trigger_selected_ = 0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (trigger.field_2._M_local_buf + 8),&this->file_path_,"/trigger");
  std::ifstream::ifstream(local_450,(string *)(trigger.field_2._M_local_buf + 8),_S_in);
  std::__cxx11::string::~string((string *)(trigger.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(entry.field_2._M_local_buf + 8));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            (local_450,(string *)(entry.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_4b0);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)&left,(string *)(entry.field_2._M_local_buf + 8),_Var2);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&left,(string *)local_4b0,' ');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    pcVar4 = (char *)std::__cxx11::string::front();
    if (*pcVar4 == '[') {
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->trigger_entries_);
      this->trigger_selected_ = (int)sVar5;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->trigger_entries_,(value_type *)local_4b0);
  }
  right = std::__cxx11::string::find((char)&entry + '\x18',0x5b);
  local_648 = std::__cxx11::string::find((char)&entry + '\x18',0x5d);
  if (((right < local_648) && (right != 0xffffffffffffffff)) && (local_648 != 0xffffffffffffffff)) {
    std::__cxx11::string::substr((ulong)local_668,(ulong)((long)&entry.field_2 + 8));
    std::__cxx11::string::operator=((string *)&this->trigger_,local_668);
    std::__cxx11::string::~string(local_668);
  }
  else {
    std::__cxx11::string::operator=((string *)&this->trigger_,"error");
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&left);
  std::__cxx11::string::~string((string *)local_4b0);
  std::__cxx11::string::~string((string *)(entry.field_2._M_local_buf + 8));
  std::ifstream::~ifstream(local_450);
  return;
}

Assistant:

void FetchState() {
    std::ifstream(file_path_ + "/brightness") >> brightness_;
    trigger_entries_.clear();
    trigger_selected_ = 0;

    std::ifstream file(file_path_ + "/trigger");
    std::string trigger;
    std::getline(file, trigger);

    std::string entry;
    std::stringstream ss(trigger);
    while (std::getline(ss, entry, ' ')) {
      if (entry.front() == '[')
        trigger_selected_ = trigger_entries_.size();
      trigger_entries_.push_back(entry);
    }

    size_t left = trigger.find('[');
    size_t right = trigger.find(']');
    if (left < right && left != std::string::npos && right != std::string::npos)
      trigger_ = trigger.substr(left + 1, right - left - 1);
    else
      trigger_ = "error";
  }